

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall PossibleContentsTest::~PossibleContentsTest(PossibleContentsTest *this)

{
  PossibleContentsTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PossibleContentsTest_003508e8;
  wasm::PossibleContents::~PossibleContents(&this->coneFuncref1);
  wasm::PossibleContents::~PossibleContents(&this->coneFuncref);
  wasm::PossibleContents::~PossibleContents(&this->coneAnyref);
  wasm::PossibleContents::~PossibleContents(&this->many);
  wasm::PossibleContents::~PossibleContents(&this->exactNonNullFuncSignatureType);
  wasm::PossibleContents::~PossibleContents(&this->exactFuncSignatureType);
  wasm::PossibleContents::~PossibleContents(&this->exactNonNullI31ref);
  wasm::PossibleContents::~PossibleContents(&this->exactNonNullFuncref);
  wasm::PossibleContents::~PossibleContents(&this->exactNonNullAnyref);
  wasm::PossibleContents::~PossibleContents(&this->exactI31ref);
  wasm::PossibleContents::~PossibleContents(&this->exactStructref);
  wasm::PossibleContents::~PossibleContents(&this->exactFuncref);
  wasm::PossibleContents::~PossibleContents(&this->exactAnyref);
  wasm::PossibleContents::~PossibleContents(&this->exactI32);
  wasm::PossibleContents::~PossibleContents(&this->nonNullFunc);
  wasm::PossibleContents::~PossibleContents(&this->nonNullFuncGlobal);
  wasm::PossibleContents::~PossibleContents(&this->funcGlobal);
  wasm::PossibleContents::~PossibleContents(&this->anyGlobal);
  wasm::PossibleContents::~PossibleContents(&this->f64Global);
  wasm::PossibleContents::~PossibleContents(&this->i32Global2);
  wasm::PossibleContents::~PossibleContents(&this->i32Global1);
  wasm::PossibleContents::~PossibleContents(&this->i31Null);
  wasm::PossibleContents::~PossibleContents(&this->funcNull);
  wasm::PossibleContents::~PossibleContents(&this->anyNull);
  wasm::PossibleContents::~PossibleContents(&this->f64One);
  wasm::PossibleContents::~PossibleContents(&this->i32One);
  wasm::PossibleContents::~PossibleContents(&this->i32Zero);
  wasm::PossibleContents::~PossibleContents(&this->none);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void SetUp() override {
    // Use nominal typing to test struct types.
    wasm::setTypeSystem(TypeSystem::Nominal);
  }